

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QFont::Tag> * __thiscall
QMap<QFont::Tag,_float>::keys
          (QList<QFont::Tag> *__return_storage_ptr__,QMap<QFont::Tag,_float> *this)

{
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *this_00;
  
  this_00 = (this->d).d.ptr;
  if (this_00 ==
      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (Tag *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
    ::keys(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const
    {
        if (!d)
            return {};
        return d->keys();
    }